

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O2

int mfflush(mFILE *mf)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  FILE *__stream;
  size_t bytes;
  ulong uVar5;
  
  if ((FILE *)mf->fp != (FILE *)0x0) {
    if ((m_channel_1 == mf) || (m_channel_2 == mf)) {
      uVar3 = mf->flush_pos;
      uVar5 = mf->size - uVar3;
      if (uVar3 <= mf->size && uVar5 != 0) {
        sVar2 = fwrite(mf->data + uVar3,1,uVar5,(FILE *)mf->fp);
        if (sVar2 < uVar5) {
          return -1;
        }
        iVar1 = fflush((FILE *)mf->fp);
        if (iVar1 != 0) {
          return -1;
        }
      }
      mf->size = 0;
      mf->offset = 0;
      mf->flush_pos = 0;
    }
    if ((mf->mode & 2U) != 0) {
      uVar3 = mf->flush_pos;
      __stream = (FILE *)mf->fp;
      uVar5 = mf->size - uVar3;
      if (uVar3 <= mf->size && uVar5 != 0) {
        if ((mf->mode & 0x20U) == 0) {
          fseek(__stream,uVar3,0);
          __stream = (FILE *)mf->fp;
          uVar3 = mf->flush_pos;
        }
        sVar2 = fwrite(mf->data + uVar3,1,uVar5,__stream);
        if (sVar2 < uVar5) {
          return -1;
        }
        iVar1 = fflush((FILE *)mf->fp);
        if (iVar1 != 0) {
          return -1;
        }
        __stream = (FILE *)mf->fp;
      }
      lVar4 = ftell(__stream);
      if (lVar4 != -1) {
        iVar1 = fileno((FILE *)mf->fp);
        lVar4 = ftell((FILE *)mf->fp);
        iVar1 = ftruncate(iVar1,lVar4);
        if (iVar1 == -1) {
          return -1;
        }
      }
      mf->flush_pos = mf->size;
    }
  }
  return 0;
}

Assistant:

int mfflush(mFILE *mf) {
    if (!mf->fp)
	return 0;

    /* FIXME: only do this when opened in write mode */
    if (mf == m_channel[1] || mf == m_channel[2]) {
	if (mf->flush_pos < mf->size) {
	    size_t bytes = mf->size - mf->flush_pos;
	    if (fwrite(mf->data + mf->flush_pos, 1, bytes, mf->fp) < bytes)
		return -1;
	    if (0 != fflush(mf->fp))
		return -1;
	}

	/* Stdout & stderr are non-seekable streams so throw away the data */
	mf->offset = mf->size = mf->flush_pos = 0;
    }

    /* only flush when opened in write mode */
    if (mf->mode & MF_WRITE) {
	if (mf->flush_pos < mf->size) {
	    size_t bytes = mf->size - mf->flush_pos;
	    if (!(mf->mode & MF_MODEX)) {
		fseek(mf->fp, mf->flush_pos, SEEK_SET);
	    }
	    if (fwrite(mf->data + mf->flush_pos, 1, bytes, mf->fp) < bytes)
		return -1;
	    if (0 != fflush(mf->fp))
		return -1;
	}
	if (ftell(mf->fp) != -1 &&
	    ftruncate(fileno(mf->fp), ftell(mf->fp)) == -1)
		return -1;
	mf->flush_pos = mf->size;
    }

    return 0;
}